

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_events_cpp.cpp
# Opt level: O0

int main(void)

{
  _Bool _Var1;
  uint uVar2;
  mfb_update_state mVar3;
  mfb_update_state state;
  int i;
  Events e;
  mfb_window *window;
  int seed;
  int carry;
  int noise;
  _Placeholder<1> *in_stack_fffffffffffffcb8;
  _Placeholder<3> *__args_3;
  _Placeholder<2> *in_stack_fffffffffffffcc0;
  _Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))(mfb_window_*,_mfb_mouse_button,_mfb_key_mod,_bool)>
  *in_stack_fffffffffffffcc8;
  _Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))(mfb_window_*,_mfb_key_mod,_float,_float)>
  *__f;
  function<void_(mfb_window_*,_mfb_mouse_button,_mfb_key_mod,_bool)> *in_stack_fffffffffffffcd0;
  _Placeholder<1> *in_stack_fffffffffffffcd8;
  _Placeholder<1> *__args_1;
  Events **in_stack_fffffffffffffce0;
  Events **__args;
  offset_in_Events_to_subr *in_stack_fffffffffffffce8;
  offset_in_Events_to_subr *__f_00;
  _Placeholder<4> *in_stack_fffffffffffffd00;
  _Placeholder<4> *__args_4;
  mfb_window *in_stack_fffffffffffffd08;
  mfb_window *window_00;
  function<void_(mfb_window_*,_int,_int)> *in_stack_fffffffffffffd10;
  function<void_(mfb_window_*,_mfb_key_mod,_float,_float)> *func;
  int local_2b4;
  _Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))(mfb_window_*,_mfb_key_mod,_float,_float)>
  local_298 [2];
  mfb_window *in_stack_fffffffffffffd98;
  _Placeholder<1> local_248 [24];
  Events *local_230 [4];
  undefined1 *local_210;
  code *local_208;
  undefined8 local_200;
  offset_in_Events_to_subr local_1f8 [7];
  undefined1 *local_1c0;
  code *local_1b8;
  undefined8 local_1b0;
  uint in_stack_fffffffffffffe5c;
  uint in_stack_fffffffffffffe60;
  uint in_stack_fffffffffffffe64;
  char *in_stack_fffffffffffffe68;
  _Placeholder<4> local_190 [32];
  undefined1 *local_170;
  code *local_168;
  undefined8 local_160;
  mfb_window local_158 [24];
  function<void_(mfb_window_*,_mfb_key_mod,_float,_float)> local_140;
  undefined1 *local_120;
  code *local_118;
  undefined8 local_110;
  undefined1 *local_d0;
  code *local_c8;
  undefined8 local_c0;
  undefined1 *local_70;
  code *local_68;
  undefined8 local_60;
  undefined1 local_19;
  mfb_window *local_18;
  uint local_10;
  uint local_c;
  uint local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = 0xbeef;
  local_18 = mfb_open_ex(in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
                         in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
  if (local_18 != (mfb_window *)0x0) {
    local_68 = Events::active;
    local_60 = 0;
    local_70 = &local_19;
    std::
    bind<void(Events::*)(mfb_window*,bool),Events*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
              ((offset_in_Events_to_subr *)in_stack_fffffffffffffcd8,
               (Events **)in_stack_fffffffffffffcd0,(_Placeholder<1> *)in_stack_fffffffffffffcc8,
               in_stack_fffffffffffffcc0);
    std::function<void(mfb_window*,bool)>::
    function<std::_Bind<void(Events::*(Events*,std::_Placeholder<1>,std::_Placeholder<2>))(mfb_window*,bool)>,void>
              ((function<void_(mfb_window_*,_bool)> *)in_stack_fffffffffffffcd0,
               (_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(mfb_window_*,_bool)>
                *)in_stack_fffffffffffffcc8);
    mfb_set_active_callback
              ((function<void_(mfb_window_*,_bool)> *)in_stack_fffffffffffffd10,
               in_stack_fffffffffffffd08);
    std::function<void_(mfb_window_*,_bool)>::~function
              ((function<void_(mfb_window_*,_bool)> *)0x10367a);
    local_c8 = Events::resize;
    local_c0 = 0;
    local_d0 = &local_19;
    std::
    bind<void(Events::*)(mfb_window*,int,int),Events*,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&>
              ((offset_in_Events_to_subr *)in_stack_fffffffffffffcd8,
               (Events **)in_stack_fffffffffffffcd0,(_Placeholder<1> *)in_stack_fffffffffffffcc8,
               in_stack_fffffffffffffcc0,(_Placeholder<3> *)in_stack_fffffffffffffcb8);
    std::function<void(mfb_window*,int,int)>::
    function<std::_Bind<void(Events::*(Events*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(mfb_window*,int,int)>,void>
              ((function<void_(mfb_window_*,_int,_int)> *)in_stack_fffffffffffffcd0,
               (_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(mfb_window_*,_int,_int)>
                *)in_stack_fffffffffffffcc8);
    mfb_set_resize_callback(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    std::function<void_(mfb_window_*,_int,_int)>::~function
              ((function<void_(mfb_window_*,_int,_int)> *)0x103714);
    local_118 = Events::close;
    local_110 = 0;
    local_120 = &local_19;
    std::bind<bool(Events::*)(mfb_window*),Events*,std::_Placeholder<1>const&>
              (&in_stack_fffffffffffffcc8->_M_f,(Events **)in_stack_fffffffffffffcc0,
               in_stack_fffffffffffffcb8);
    std::function<bool(mfb_window*)>::
    function<std::_Bind<bool(Events::*(Events*,std::_Placeholder<1>))(mfb_window*)>,void>
              ((function<bool_(mfb_window_*)> *)in_stack_fffffffffffffcd0,
               (_Bind<bool_(Events::*(Events_*,_std::_Placeholder<1>))(mfb_window_*)> *)
               in_stack_fffffffffffffcc8);
    mfb_set_close_callback
              ((function<bool_(mfb_window_*)> *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08)
    ;
    std::function<bool_(mfb_window_*)>::~function((function<bool_(mfb_window_*)> *)0x1037a0);
    local_168 = Events::keyboard;
    local_160 = 0;
    local_170 = &local_19;
    window_00 = local_158;
    std::
    bind<void(Events::*)(mfb_window*,mfb_key,mfb_key_mod,bool),Events*,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&,std::_Placeholder<4>const&>
              (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
               (_Placeholder<2> *)in_stack_fffffffffffffcd0,
               (_Placeholder<3> *)in_stack_fffffffffffffcc8,in_stack_fffffffffffffd00);
    func = &local_140;
    std::function<void(mfb_window*,mfb_key,mfb_key_mod,bool)>::
    function<std::_Bind<void(Events::*(Events*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>,std::_Placeholder<4>))(mfb_window*,mfb_key,mfb_key_mod,bool)>,void>
              ((function<void_(mfb_window_*,_mfb_key,_mfb_key_mod,_bool)> *)
               in_stack_fffffffffffffcd0,
               (_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))(mfb_window_*,_mfb_key,_mfb_key_mod,_bool)>
                *)in_stack_fffffffffffffcc8);
    mfb_set_keyboard_callback
              ((function<void_(mfb_window_*,_mfb_key,_mfb_key_mod,_bool)> *)func,window_00);
    std::function<void_(mfb_window_*,_mfb_key,_mfb_key_mod,_bool)>::~function
              ((function<void_(mfb_window_*,_mfb_key,_mfb_key_mod,_bool)> *)0x103847);
    local_1b8 = Events::char_input;
    local_1b0 = 0;
    local_1c0 = &local_19;
    std::
    bind<void(Events::*)(mfb_window*,unsigned_int),Events*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
              ((offset_in_Events_to_subr *)in_stack_fffffffffffffcd8,
               (Events **)in_stack_fffffffffffffcd0,(_Placeholder<1> *)in_stack_fffffffffffffcc8,
               in_stack_fffffffffffffcc0);
    __args_4 = local_190;
    std::function<void(mfb_window*,unsigned_int)>::
    function<std::_Bind<void(Events::*(Events*,std::_Placeholder<1>,std::_Placeholder<2>))(mfb_window*,unsigned_int)>,void>
              ((function<void_(mfb_window_*,_unsigned_int)> *)in_stack_fffffffffffffcd0,
               (_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(mfb_window_*,_unsigned_int)>
                *)in_stack_fffffffffffffcc8);
    mfb_set_char_input_callback((function<void_(mfb_window_*,_unsigned_int)> *)func,window_00);
    std::function<void_(mfb_window_*,_unsigned_int)>::~function
              ((function<void_(mfb_window_*,_unsigned_int)> *)0x1038da);
    local_208 = Events::mouse_button;
    local_200 = 0;
    local_210 = &local_19;
    __args_3 = (_Placeholder<3> *)&std::placeholders::_4;
    __f_00 = local_1f8;
    std::
    bind<void(Events::*)(mfb_window*,mfb_mouse_button,mfb_key_mod,bool),Events*,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&,std::_Placeholder<4>const&>
              (__f_00,in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
               (_Placeholder<2> *)in_stack_fffffffffffffcd0,
               (_Placeholder<3> *)in_stack_fffffffffffffcc8,__args_4);
    std::function<void(mfb_window*,mfb_mouse_button,mfb_key_mod,bool)>::
    function<std::_Bind<void(Events::*(Events*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>,std::_Placeholder<4>))(mfb_window*,mfb_mouse_button,mfb_key_mod,bool)>,void>
              (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    mfb_set_mouse_button_callback
              ((function<void_(mfb_window_*,_mfb_mouse_button,_mfb_key_mod,_bool)> *)func,window_00)
    ;
    std::function<void_(mfb_window_*,_mfb_mouse_button,_mfb_key_mod,_bool)>::~function
              ((function<void_(mfb_window_*,_mfb_mouse_button,_mfb_key_mod,_bool)> *)0x103981);
    __args_1 = local_248;
    std::
    bind<void(Events::*)(mfb_window*,int,int),Events*,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&>
              ((offset_in_Events_to_subr *)__args_1,(Events **)in_stack_fffffffffffffcd0,
               (_Placeholder<1> *)in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,__args_3);
    __args = local_230;
    std::function<void(mfb_window*,int,int)>::
    function<std::_Bind<void(Events::*(Events*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(mfb_window*,int,int)>,void>
              ((function<void_(mfb_window_*,_int,_int)> *)in_stack_fffffffffffffcd0,
               (_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(mfb_window_*,_int,_int)>
                *)in_stack_fffffffffffffcc8);
    mfb_set_mouse_move_callback((function<void_(mfb_window_*,_int,_int)> *)func,window_00);
    std::function<void_(mfb_window_*,_int,_int)>::~function
              ((function<void_(mfb_window_*,_int,_int)> *)0x103a1b);
    __f = local_298;
    std::
    bind<void(Events::*)(mfb_window*,mfb_key_mod,float,float),Events*,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&,std::_Placeholder<4>const&>
              (__f_00,__args,__args_1,(_Placeholder<2> *)in_stack_fffffffffffffcd0,
               (_Placeholder<3> *)__f,__args_4);
    std::function<void(mfb_window*,mfb_key_mod,float,float)>::
    function<std::_Bind<void(Events::*(Events*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>,std::_Placeholder<4>))(mfb_window*,mfb_key_mod,float,float)>,void>
              ((function<void_(mfb_window_*,_mfb_key_mod,_float,_float)> *)(local_298 + 1),__f);
    mfb_set_mouse_scroll_callback(func,window_00);
    std::function<void_(mfb_window_*,_mfb_key_mod,_float,_float)>::~function
              ((function<void_(mfb_window_*,_mfb_key_mod,_float,_float)> *)0x103ac2);
    mfb_set_user_data(local_18,"Input Events CPP Test");
    do {
      for (local_2b4 = 0; local_2b4 < 480000; local_2b4 = local_2b4 + 1) {
        uVar2 = local_10 ^ (int)local_10 >> 3;
        local_c = uVar2 & 1;
        local_10 = local_c << 0x1e | (int)local_10 >> 1;
        local_8 = (int)uVar2 >> 1 & 0xff;
        g_buffer[local_2b4] = local_8 << 0x10 | 0xff000000 | local_8 << 8 | local_8;
      }
      mVar3 = mfb_update((mfb_window *)__f,in_stack_fffffffffffffcc0);
    } while ((mVar3 == STATE_OK) && (_Var1 = mfb_wait_sync(in_stack_fffffffffffffd98), _Var1));
  }
  return 0;
}

Assistant:

int
main()
{
    int noise, carry, seed = 0xbeef;

    struct mfb_window *window = mfb_open_ex("Input Events CPP Test", WIDTH, HEIGHT, WF_RESIZABLE);
    if (!window)
        return 0;

    Events e;

#if defined(kUseOldFunctions)

    mfb_set_active_callback(window, &e, &Events::active);
    mfb_set_resize_callback(window, &e, &Events::resize);
    mfb_set_close_callback(window, &e, &Events::close);
    mfb_set_keyboard_callback(window, &e, &Events::keyboard);
    mfb_set_char_input_callback(window, &e, &Events::char_input);
    mfb_set_mouse_button_callback(window, &e, &Events::mouse_button);
    mfb_set_mouse_move_callback(window, &e, &Events::mouse_move);
    mfb_set_mouse_scroll_callback(window, &e, &Events::mouse_scroll);

#elif defined(kUseLambdas)

    mfb_set_active_callback([](struct mfb_window *window, bool isActive) {
        const char *window_title = "";
        if(window) {
            window_title = (const char *) mfb_get_user_data(window);
        }
        fprintf(stdout, "%s > active: %d (lambda)\n", window_title, isActive);
    }, window);

    mfb_set_resize_callback([](struct mfb_window *window, int width, int height) {
        uint32_t x = 0;
        uint32_t y = 0;
        const char *window_title = "";
        if(window) {
            window_title = (const char *) mfb_get_user_data(window);
        }

        fprintf(stdout, "%s > resize: %d, %d\n", window_title, width, height);
        if(width > WIDTH) {
            x = (width - WIDTH) >> 1;
            width = WIDTH;
        }
        if(height > HEIGHT) {
            y = (height - HEIGHT) >> 1;
            height = HEIGHT;
        }
        mfb_set_viewport(window, x, y, width, height);
    }, window);

    mfb_set_close_callback([](struct mfb_window *window) {
        const char* window_title = "";
        if (window) {
            window_title = (const char*) mfb_get_user_data(window);
        }
        fprintf(stdout, "%s > close\n", window_title);
        return true;    // true => confirm close
                        // false => don't close
    }, window);

    mfb_set_keyboard_callback([](struct mfb_window *window, mfb_key key, mfb_key_mod mod, bool isPressed) {
        const char *window_title = "";
        if(window) {
            window_title = (const char *) mfb_get_user_data(window);
        }
        fprintf(stdout, "%s > keyboard: key: %s (pressed: %d) [key_mod: %x]\n", window_title, mfb_get_key_name(key), isPressed, mod);
        if(key == KB_KEY_ESCAPE) {
            mfb_close(window);
        }
    }, window);

    mfb_set_char_input_callback([](struct mfb_window *window, unsigned int charCode) {
        const char *window_title = "";
        if(window) {
            window_title = (const char *) mfb_get_user_data(window);
        }
        fprintf(stdout, "%s > charCode: %d\n", window_title, charCode);
    }, window);

    mfb_set_mouse_button_callback([](struct mfb_window *window, mfb_mouse_button button, mfb_key_mod mod, bool isPressed) {
        const char  *window_title = "";
        int         x, y;

        if(window) {
            window_title = (const char *) mfb_get_user_data(window);
        }
        x = mfb_get_mouse_x(window);
        y = mfb_get_mouse_y(window);
        fprintf(stdout, "%s > mouse_button: button: %d (pressed: %d) (at: %d, %d) [key_mod: %x]\n", window_title, button, isPressed, x, y, mod);
    }, window);

    mfb_set_mouse_move_callback([](struct mfb_window *window, int x, int y) {
        kUnused(window);
        kUnused(x);
        kUnused(y);
        //const char *window_title = "";
        //if(window) {
        //    window_title = (const char *) mfb_get_user_data(window);
        //}
        //fprintf(stdout, "%s > mouse_move: %d, %d\n", window_title, x, y);
    }, window);

    mfb_set_mouse_scroll_callback([](struct mfb_window *window, mfb_key_mod mod, float deltaX, float deltaY) {
        const char *window_title = "";
        if(window) {
            window_title = (const char *) mfb_get_user_data(window);
        }
        fprintf(stdout, "%s > mouse_scroll: x: %f, y: %f [key_mod: %x]\n", window_title, deltaX, deltaY, mod);
    }, window);

#else

    using namespace std::placeholders;

    mfb_set_active_callback      (std::bind(&Events::active,       &e, _1, _2),         window);
    mfb_set_resize_callback      (std::bind(&Events::resize,       &e, _1, _2, _3),     window);
    mfb_set_close_callback       (std::bind(&Events::close,        &e, _1),             window);
    mfb_set_keyboard_callback    (std::bind(&Events::keyboard,     &e, _1, _2, _3, _4), window);
    mfb_set_char_input_callback  (std::bind(&Events::char_input,   &e, _1, _2),         window);
    mfb_set_mouse_button_callback(std::bind(&Events::mouse_button, &e, _1, _2, _3, _4), window);
    mfb_set_mouse_move_callback  (std::bind(&Events::mouse_move,   &e, _1, _2, _3),     window);
    mfb_set_mouse_scroll_callback(std::bind(&Events::mouse_scroll, &e, _1, _2, _3, _4), window);

#endif

    mfb_set_user_data(window, (void *) "Input Events CPP Test");

    do {
        int         i;
        mfb_update_state state;

        for (i = 0; i < WIDTH * HEIGHT; ++i) {
            noise = seed;
            noise >>= 3;
            noise ^= seed;
            carry = noise & 1;
            noise >>= 1;
            seed >>= 1;
            seed |= (carry << 30);
            noise &= 0xFF;
            g_buffer[i] = MFB_ARGB(0xff, noise, noise, noise);
        }

        state = mfb_update(window, g_buffer);
        if (state != STATE_OK) {
            window = 0x0;
            break;
        }
    } while(mfb_wait_sync(window));

    return 0;
}